

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O3

void refresh_stt_win(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  char *__s;
  WINDOW *pWVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  int iVar6;
  int iVar7;
  _Base_ptr p_Var8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  Uniforms *pUVar12;
  int iVar13;
  float fVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  if ((stt_visible) && (uniforms != (Uniforms *)0x0)) {
    werase(stt_win);
    iVar10 = stt_y;
    if (have_colors == true) {
      wattr_on(stt_win,0x100,0);
    }
    wborder(stt_win,0x7c,0x20,0x20,0x20,0x2b,0x2b,0x2b,0x2b);
    p_Var8 = (uniforms->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pUVar12 = uniforms;
    if ((_Rb_tree_header *)p_Var8 != &(uniforms->functions)._M_t._M_impl.super__Rb_tree_header) {
      do {
        pWVar3 = stt_win;
        iVar13 = stt_x;
        if (((char)p_Var8[5]._M_color == _S_black) && (p_Var8[3]._M_left != (_Base_ptr)0x0)) {
          uVar2 = *(undefined8 *)(p_Var8 + 1);
          (*(code *)p_Var8[3]._M_right)(&__str,p_Var8 + 3);
          mvwprintw(pWVar3,iVar10,iVar13,"%23s  %s",uVar2,__str._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          iVar10 = iVar10 + 1;
          pUVar12 = uniforms;
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &(pUVar12->functions)._M_t._M_impl.super__Rb_tree_header
              );
    }
    p_Var8 = (pUVar12->sequences)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var8 != &(pUVar12->sequences)._M_t._M_impl.super__Rb_tree_header) {
      do {
        pWVar3 = stt_win;
        iVar13 = stt_x;
        lVar9 = (long)p_Var8[2]._M_parent - *(long *)(p_Var8 + 2);
        if (lVar9 != 0) {
          uVar2 = *(undefined8 *)(p_Var8 + 1);
          UniformData::print_abi_cxx11_
                    (&__str,(UniformData *)
                            (*(long *)(p_Var8 + 2) +
                            (pUVar12->m_frame % (ulong)((lVar9 >> 4) * 0x6db6db6db6db6db7)) * 0x70))
          ;
          mvwprintw(pWVar3,iVar10,iVar13,"%23s  %s",uVar2,__str._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          iVar10 = iVar10 + 1;
          pUVar12 = uniforms;
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &(pUVar12->sequences)._M_t._M_impl.super__Rb_tree_header
              );
    }
    p_Var8 = (pUVar12->super_Scene).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var8 !=
        &(pUVar12->super_Scene).textures._M_t._M_impl.super__Rb_tree_header) {
      do {
        pWVar3 = stt_win;
        iVar13 = stt_x;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        std::__cxx11::string::append((char *)&__str);
        _Var5 = __str._M_dataplus;
        iVar6 = (**(code **)(**(long **)(p_Var8 + 2) + 0x60))();
        iVar7 = (**(code **)(**(long **)(p_Var8 + 2) + 0x68))();
        mvwprintw((double)iVar6,(double)iVar7,pWVar3,iVar10,iVar13,"%23s  %.1f,%.1f",_Var5._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        iVar10 = iVar10 + 1;
        pUVar12 = uniforms;
      } while ((_Rb_tree_header *)p_Var8 !=
               &(uniforms->super_Scene).textures._M_t._M_impl.super__Rb_tree_header);
    }
    p_Var8 = (pUVar12->super_Scene).streams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var8 !=
        &(pUVar12->super_Scene).streams._M_t._M_impl.super__Rb_tree_header) {
      paVar1 = &__str.field_2;
      do {
        pWVar3 = stt_win;
        iVar13 = stt_x;
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        std::__cxx11::string::append((char *)&__str);
        _Var5 = __str._M_dataplus;
        fVar14 = (float)(**(code **)(**(long **)(p_Var8 + 2) + 0xe8))();
        mvwprintw((double)fVar14,pWVar3,iVar10,iVar13,"%23s  %.3f",_Var5._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        pWVar3 = stt_win;
        iVar13 = stt_x;
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        std::__cxx11::string::append((char *)&__str);
        _Var5 = __str._M_dataplus;
        fVar14 = (float)(**(code **)(**(long **)(p_Var8 + 2) + 0xe0))();
        mvwprintw((double)fVar14,pWVar3,iVar10 + 1,iVar13,"%23s  %.3f",_Var5._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        pWVar3 = stt_win;
        iVar13 = stt_x;
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        std::__cxx11::string::append((char *)&__str);
        _Var5 = __str._M_dataplus;
        fVar14 = (float)(**(code **)(**(long **)(p_Var8 + 2) + 0xd0))();
        mvwprintw((double)fVar14,pWVar3,iVar10 + 2,iVar13,"%23s  %.3f",_Var5._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        pWVar3 = stt_win;
        iVar13 = stt_x;
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        std::__cxx11::string::append((char *)&__str);
        _Var5 = __str._M_dataplus;
        fVar14 = (float)(**(code **)(**(long **)(p_Var8 + 2) + 200))();
        mvwprintw((double)fVar14,pWVar3,iVar10 + 3,iVar13,"%23s  %.3f",_Var5._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        pWVar3 = stt_win;
        iVar13 = stt_x;
        __str._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__str,*(long *)(p_Var8 + 1),
                   (long)&(p_Var8[1]._M_parent)->_M_color + *(long *)(p_Var8 + 1));
        std::__cxx11::string::append((char *)&__str);
        _Var5 = __str._M_dataplus;
        fVar14 = (float)(**(code **)(**(long **)(p_Var8 + 2) + 0xc0))();
        mvwprintw((double)fVar14,pWVar3,iVar10 + 4,iVar13,"%23s  %.3f",_Var5._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar1) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        iVar10 = iVar10 + 5;
      } while ((_Rb_tree_header *)p_Var8 !=
               &(uniforms->super_Scene).streams._M_t._M_impl.super__Rb_tree_header);
    }
    if (have_colors != false) {
      wattr_off(stt_win,0x100,0);
    }
    if ((have_colors & 1U) != 0) {
      wattr_on(stt_win,0x200,0);
    }
    p_Var8 = (uniforms->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uniforms_starts_at = iVar10;
    if ((_Rb_tree_header *)p_Var8 != &(uniforms->data)._M_t._M_impl.super__Rb_tree_header) {
      iVar13 = 0;
      pUVar12 = uniforms;
      do {
        if (*(ulong *)(p_Var8 + 5) < 5) {
          mvwprintw(stt_win,iVar10,stt_x,"%23s",*(undefined8 *)(p_Var8 + 1));
          sVar4 = mouse_at_key_abi_cxx11_._M_string_length;
          iVar6 = (int)((ulong)((long)stt_width - (long)stt_values_col) / *(ulong *)(p_Var8 + 5)) +
                  stt_x;
          if (iVar13 == mouse_at) {
            __s = *(char **)(p_Var8 + 1);
            strlen(__s);
            std::__cxx11::string::_M_replace(0x430c60,0,(char *)sVar4,(ulong)__s);
            mouse_at_index = 0;
            if (stt_values_col + iVar6 < mouse_x) {
              mouse_at_index = (size_t)((mouse_x - stt_values_col) / iVar6);
            }
          }
          if (*(long *)(p_Var8 + 5) != 0) {
            uVar11 = 0;
            do {
              if (((iVar13 == mouse_at) && (uVar11 == mouse_at_index)) && (have_colors == true)) {
                wattr_on(stt_win,0x200,0);
              }
              mvwprintw((double)*(float *)((long)&p_Var8[4]._M_left + uVar11 * 4),stt_win,iVar10,
                        iVar6 * (int)uVar11 + stt_values_col,"%.3f");
              if (have_colors == true) {
                wattr_off(stt_win,0x200,0);
              }
            } while ((uVar11 < 3) && (uVar11 = uVar11 + 1, uVar11 < *(ulong *)(p_Var8 + 5)));
          }
          iVar10 = iVar10 + 1;
          iVar13 = iVar13 + 1;
          pUVar12 = uniforms;
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &(pUVar12->data)._M_t._M_impl.super__Rb_tree_header);
    }
    if (have_colors != false) {
      wattr_on(stt_win,0x200,0);
    }
    wrefresh(stt_win);
    refresh_cursor();
  }
  return;
}

Assistant:

void refresh_stt_win() {
    if (!stt_visible || uniforms == nullptr)
        return;

    werase(stt_win);

    size_t y = stt_y;

    if (have_colors) wattron(stt_win, COLOR_PAIR(1));
    wborder(stt_win, '|', ' ', ' ', ' ', '+', '+', '+', '+');
    // box(stt_win, 0, 0);
    // Print Native Uniforms (they carry functions) that are present on the shader
    for (UniformFunctionsMap::iterator it= uniforms->functions.begin(); it != uniforms->functions.end(); ++it)
        if (it->second.present && it->second.print)
            mvwprintw(stt_win, y++, stt_x, "%23s  %s", it->first.c_str(), it->second.print().c_str() );

    for (UniformSequenceMap::iterator it= uniforms->sequences.begin(); it != uniforms->sequences.end(); ++it) {
        if (it->second.size() > 0) {
            size_t frame = uniforms->getFrame() % it->second.size();
            mvwprintw(stt_win, y++, stt_x, "%23s  %s", it->first.c_str(), it->second[frame].print().c_str() );
        }
    }

    for (vera::TexturesMap::iterator it = uniforms->textures.begin(); it != uniforms->textures.end(); ++it)
        mvwprintw(stt_win, y++, stt_x, "%23s  %.1f,%.1f", (it->first + "Resolution").c_str(), (float)it->second->getWidth(), (float)it->second->getHeight());

    for (vera::TextureStreamsMap::iterator it = uniforms->streams.begin(); it != uniforms->streams.end(); ++it) {
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"CurrentFrame").c_str(), it->second->getCurrentFrame() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"TotalFrames").c_str(), it->second->getTotalFrames() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"Time").c_str(), it->second->getTime() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"Duration").c_str(), it->second->getDuration() );
        mvwprintw(stt_win, y++, stt_x, "%23s  %.3f", (it->first+"Fps").c_str(), it->second->getFps() );
    }
    if (have_colors) wattroff(stt_win, COLOR_PAIR(1));

    if (have_colors) wattron(stt_win, COLOR_PAIR(2));
    uniforms_starts_at = y;
    int i = 0;
    for (UniformDataMap::iterator it= uniforms->data.begin(); it != uniforms->data.end(); ++it) {
        if (it->second.size > 4)
            continue;

        mvwprintw(stt_win, y, stt_x, "%23s", it->first.c_str());
        int cell_width = stt_x + (stt_width - stt_values_col) / it->second.size;

        if (i == mouse_at) {
            mouse_at_key = it->first.c_str();
            mouse_at_index = 0;
            
            if (mouse_x > stt_values_col + cell_width)
                mouse_at_index = (mouse_x - stt_values_col) / cell_width;
        }

        for (size_t j = 0 ; j < it->second.size && j < 4; j++) {
            if (i == mouse_at && j == mouse_at_index)
                if (have_colors) wattron(stt_win, COLOR_PAIR(2));
            mvwprintw(stt_win, y, stt_values_col + cell_width * j, "%.3f",it->second.value[j]);
            if (have_colors) wattroff(stt_win, COLOR_PAIR(2));
        }
        y++;
        i++;
    }
    if (have_colors) wattron(stt_win, COLOR_PAIR(2));

    // if (y > stt_win_height) {
    //     stt_win_height = y + 1;
    //     wresize(stt_win, stt_win_height, stt_width );
    //     mvwin(stt_win, 0, COLS - stt_width );
    // }

    wrefresh(stt_win);
    refresh_cursor();
}